

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O1

_Bool COSE_Mac_validate(HCOSE_MAC h,HCOSE_RECIPIENT hRecip,cose_errback *perr)

{
  _Bool _Var1;
  COSE_MacMessage *p;
  
  _Var1 = _COSE_IsInList(MacRoot,(COSE *)h);
  if (_Var1) {
    _Var1 = IsValidRecipientHandle(hRecip);
    if (_Var1) {
      _Var1 = _COSE_Mac_validate((COSE_MacMessage *)h,(COSE_RecipientInfo *)hRecip,(byte *)0x0,0,
                                 "MAC",perr);
      return _Var1;
    }
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  return false;
}

Assistant:

bool COSE_Mac_validate(HCOSE_MAC h, HCOSE_RECIPIENT hRecip, cose_errback * perr)
{
	COSE_MacMessage * pcose = (COSE_MacMessage *)h;
	COSE_RecipientInfo * pRecip = (COSE_RecipientInfo *)hRecip;

	CHECK_CONDITION(IsValidMacHandle(h) && IsValidRecipientHandle(hRecip), COSE_ERR_INVALID_PARAMETER);

	return _COSE_Mac_validate(pcose, pRecip, NULL, 0, "MAC", perr);

errorReturn:
	return false;
}